

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scenario.cpp
# Opt level: O1

void __thiscall
multi_agent_planning::Scenario::Scenario
          (Scenario *this,
          vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
          *actions,vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
                   *graphs,int numConflicts,int numSynergies)

{
  vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
  *this_00;
  pointer *pppVar1;
  int iVar2;
  pointer peVar3;
  iterator __position;
  pointer ppVar4;
  int *piVar5;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
  *paVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  undefined8 uVar9;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
  *paVar10;
  undefined4 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  pointer pvVar15;
  iterator iVar16;
  vector<multi_agent_planning::Interaction,std::allocator<multi_agent_planning::Interaction>>
  *pvVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  Interaction *pIVar21;
  iterator iVar22;
  pointer peVar23;
  ulong uVar24;
  byte bVar25;
  Graph g;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  generated;
  Interaction local_118;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
  local_d0;
  undefined4 uStack_98;
  undefined4 local_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  property_type *local_84;
  int iStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  property_type *local_68;
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  local_60;
  
  bVar25 = 0;
  std::
  vector<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>,_std::allocator<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>_>_>
  ::vector(&this->interactionMaps,
           ((long)(actions->
                  super__Vector_base<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(actions->
                  super__Vector_base<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)&local_118);
  this_00 = &this->allActions;
  (this->allActions).
  super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->allActions).
  super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->allActions).
  super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar15 = (actions->
            super__Vector_base<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((actions->
      super__Vector_base<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar15) {
    uVar24 = 0;
    do {
      peVar3 = pvVar15[uVar24].
               super__Vector_base<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (peVar23 = pvVar15[uVar24].
                     super__Vector_base<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; peVar23 != peVar3;
          peVar23 = peVar23 + 1) {
        local_118.agentA = (int)uVar24;
        local_118.actionA.m_eproperty = peVar23->m_eproperty;
        uVar7 = (peVar23->super_edge_base<boost::directed_tag,_unsigned_long>).m_source;
        uVar8 = (peVar23->super_edge_base<boost::directed_tag,_unsigned_long>).m_target;
        local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._0_4_ =
             (undefined4)uVar7;
        local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._4_4_ =
             (undefined4)(uVar7 >> 0x20);
        local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._0_4_ =
             (undefined4)uVar8;
        local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._4_4_ =
             (undefined4)(uVar8 >> 0x20);
        __position._M_current =
             (this->allActions).
             super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->allActions).
            super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>,std::allocator<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>>>
          ::
          _M_realloc_insert<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>>
                    ((vector<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>,std::allocator<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>>>
                      *)this_00,__position,
                     (pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>
                      *)&local_118);
        }
        else {
          ((__position._M_current)->second).super_edge_base<boost::directed_tag,_unsigned_long>.
          m_target = uVar8;
          ((__position._M_current)->second).m_eproperty = local_118.actionA.m_eproperty;
          *(ulong *)__position._M_current = CONCAT44(local_118._4_4_,local_118.agentA);
          ((__position._M_current)->second).super_edge_base<boost::directed_tag,_unsigned_long>.
          m_source = uVar7;
          pppVar1 = &(this->allActions).
                     super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pppVar1 = *pppVar1 + 1;
        }
      }
      uVar24 = uVar24 + 1;
      pvVar15 = (actions->
                super__Vector_base<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar19 = ((long)(actions->
                      super__Vector_base<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar15 >> 3) *
               -0x5555555555555555;
    } while (uVar24 <= uVar19 && uVar19 - uVar24 != 0);
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  iVar18 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < numConflicts) {
    do {
      do {
        do {
          iVar12 = getRndInt((int)((ulong)((long)(this->allActions).
                                                 super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->allActions).
                                                super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 5) +
                             -1);
          iVar13 = getRndInt((int)((ulong)((long)(this->allActions).
                                                 super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->allActions).
                                                super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 5) +
                             -1);
          ppVar4 = (this_00->
                   super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        } while (ppVar4[iVar12].first == ppVar4[iVar13].first);
        local_118.agentA = iVar12;
        local_118._4_4_ = iVar13;
        iVar16 = std::
                 _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                 ::find(&local_60,(key_type *)&local_118);
      } while ((_Rb_tree_header *)iVar16._M_node != &local_60._M_impl.super__Rb_tree_header);
      local_118.agentA = iVar12;
      local_118._4_4_ = iVar13;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::_M_insert_unique<std::pair<int,int>>
                ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                  *)&local_60,(pair<int,_int> *)&local_118);
      ppVar4 = (this_00->
               super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      piVar5 = (int *)ppVar4[iVar13].second.m_eproperty;
      boost::
      adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
      ::adjacency_list(&local_d0,
                       (graphs->
                       super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + ppVar4[iVar13].first);
      iVar2 = *piVar5;
      do {
        iVar14 = getRndInt(iVar2);
      } while (iVar14 == 0);
      ppVar4 = (this->allActions).
               super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_118.agentA = ppVar4[iVar12].first;
      local_118.agentB = ppVar4[iVar13].first;
      local_118.actionA.m_eproperty = ppVar4[iVar12].second.m_eproperty;
      uVar9 = ppVar4[iVar12].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
      uVar7 = ppVar4[iVar12].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
      local_78 = (undefined4)uVar9;
      uStack_74 = (undefined4)((ulong)uVar9 >> 0x20);
      uStack_70 = (undefined4)uVar7;
      uStack_6c = (undefined4)(uVar7 >> 0x20);
      local_118.actionB.m_eproperty = ppVar4[iVar13].second.m_eproperty;
      uVar9 = ppVar4[iVar13].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
      uVar7 = ppVar4[iVar13].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
      local_94 = (undefined4)uVar9;
      uStack_90 = (undefined4)((ulong)uVar9 >> 0x20);
      uStack_8c = (undefined4)uVar7;
      uStack_88 = (undefined4)(uVar7 >> 0x20);
      local_118._4_4_ = iStack_7c;
      local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._0_4_ =
           local_78;
      local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._4_4_ =
           uStack_74;
      local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._0_4_ =
           uStack_70;
      local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._0_4_ =
           local_94;
      local_118._36_4_ = uStack_98;
      local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._4_4_ =
           uStack_90;
      local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._0_4_ =
           uStack_8c;
      local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._4_4_ =
           uStack_6c;
      local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._4_4_ =
           uStack_88;
      local_118.cost = iVar14;
      local_84 = local_118.actionB.m_eproperty;
      local_68 = local_118.actionA.m_eproperty;
      pvVar17 = (vector<multi_agent_planning::Interaction,std::allocator<multi_agent_planning::Interaction>>
                 *)std::
                   map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>
                   ::operator[]((this->interactionMaps).
                                super__Vector_base<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>,_std::allocator<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + local_118.agentA,
                                &local_118.actionA);
      iVar22._M_current = *(Interaction **)(pvVar17 + 8);
      if (iVar22._M_current == *(Interaction **)(pvVar17 + 0x10)) {
        std::
        vector<multi_agent_planning::Interaction,std::allocator<multi_agent_planning::Interaction>>
        ::_M_realloc_insert<multi_agent_planning::Interaction_const&>(pvVar17,iVar22,&local_118);
      }
      else {
        pIVar21 = &local_118;
        for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
          uVar11 = *(undefined4 *)&pIVar21->field_0x4;
          (iVar22._M_current)->agentA = pIVar21->agentA;
          *(undefined4 *)&(iVar22._M_current)->field_0x4 = uVar11;
          pIVar21 = (Interaction *)((long)pIVar21 + (ulong)bVar25 * -0x10 + 8);
          iVar22._M_current = iVar22._M_current + (ulong)bVar25 * -0x10 + 8;
        }
        *(long *)(pvVar17 + 8) = *(long *)(pvVar17 + 8) + 0x48;
      }
      if (local_d0.m_property.px != (no_property *)0x0) {
        operator_delete(local_d0.m_property.px);
      }
      std::
      vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config::stored_vertex>_>
      ::~vector(&local_d0.super_type.m_vertices);
      paVar10 = (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
                 *)local_d0.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::list_edge<unsigned_long,_multi_agent_planning::Action>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next;
      while (paVar10 != &local_d0) {
        paVar6 = (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
                  *)(paVar10->super_type).m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::list_edge<unsigned_long,_multi_agent_planning::Action>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
        operator_delete(paVar10);
        paVar10 = paVar6;
      }
      iVar18 = iVar18 + 1;
    } while (iVar18 != numConflicts);
  }
  if (0 < numSynergies) {
    iVar18 = 0;
    do {
      do {
        do {
          iVar12 = getRndInt((int)((ulong)((long)(this->allActions).
                                                 super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->allActions).
                                                super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 5) +
                             -1);
          iVar13 = getRndInt((int)((ulong)((long)(this->allActions).
                                                 super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->allActions).
                                                super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 5) +
                             -1);
          ppVar4 = (this_00->
                   super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        } while (ppVar4[iVar12].first == ppVar4[iVar13].first);
        local_118.agentA = iVar12;
        local_118._4_4_ = iVar13;
        iVar16 = std::
                 _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                 ::find(&local_60,(key_type *)&local_118);
      } while ((_Rb_tree_header *)iVar16._M_node != &local_60._M_impl.super__Rb_tree_header);
      local_118.agentA = iVar12;
      local_118._4_4_ = iVar13;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::_M_insert_unique<std::pair<int,int>>
                ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                  *)&local_60,(pair<int,_int> *)&local_118);
      ppVar4 = (this_00->
               super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      piVar5 = (int *)ppVar4[iVar13].second.m_eproperty;
      boost::
      adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
      ::adjacency_list(&local_d0,
                       (graphs->
                       super__Vector_base<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + ppVar4[iVar13].first);
      iVar2 = *piVar5;
      do {
        iVar14 = getRndInt(-iVar2,0);
      } while (iVar14 == 0);
      ppVar4 = (this->allActions).
               super__Vector_base<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_118.agentA = ppVar4[iVar12].first;
      local_118.agentB = ppVar4[iVar13].first;
      local_118.actionA.m_eproperty = ppVar4[iVar12].second.m_eproperty;
      uVar9 = ppVar4[iVar12].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
      uVar7 = ppVar4[iVar12].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
      local_78 = (undefined4)uVar9;
      uStack_74 = (undefined4)((ulong)uVar9 >> 0x20);
      uStack_70 = (undefined4)uVar7;
      uStack_6c = (undefined4)(uVar7 >> 0x20);
      local_118.actionB.m_eproperty = ppVar4[iVar13].second.m_eproperty;
      uVar9 = ppVar4[iVar13].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
      uVar7 = ppVar4[iVar13].second.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
      local_94 = (undefined4)uVar9;
      uStack_90 = (undefined4)((ulong)uVar9 >> 0x20);
      uStack_8c = (undefined4)uVar7;
      uStack_88 = (undefined4)(uVar7 >> 0x20);
      local_118._4_4_ = iStack_7c;
      local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._0_4_ =
           local_78;
      local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._4_4_ =
           uStack_74;
      local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._0_4_ =
           uStack_70;
      local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._0_4_ =
           local_94;
      local_118._36_4_ = uStack_98;
      local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_source._4_4_ =
           uStack_90;
      local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._0_4_ =
           uStack_8c;
      local_118.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._4_4_ =
           uStack_6c;
      local_118.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_target._4_4_ =
           uStack_88;
      local_118.cost = iVar14;
      local_84 = local_118.actionB.m_eproperty;
      local_68 = local_118.actionA.m_eproperty;
      pvVar17 = (vector<multi_agent_planning::Interaction,std::allocator<multi_agent_planning::Interaction>>
                 *)std::
                   map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>
                   ::operator[]((this->interactionMaps).
                                super__Vector_base<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>,_std::allocator<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + local_118.agentA,
                                &local_118.actionA);
      iVar22._M_current = *(Interaction **)(pvVar17 + 8);
      if (iVar22._M_current == *(Interaction **)(pvVar17 + 0x10)) {
        std::
        vector<multi_agent_planning::Interaction,std::allocator<multi_agent_planning::Interaction>>
        ::_M_realloc_insert<multi_agent_planning::Interaction_const&>(pvVar17,iVar22,&local_118);
      }
      else {
        pIVar21 = &local_118;
        for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
          uVar11 = *(undefined4 *)&pIVar21->field_0x4;
          (iVar22._M_current)->agentA = pIVar21->agentA;
          *(undefined4 *)&(iVar22._M_current)->field_0x4 = uVar11;
          pIVar21 = (Interaction *)((long)pIVar21 + ((ulong)bVar25 * -2 + 1) * 8);
          iVar22._M_current = iVar22._M_current + (ulong)bVar25 * -0x10 + 8;
        }
        *(long *)(pvVar17 + 8) = *(long *)(pvVar17 + 8) + 0x48;
      }
      if (local_d0.m_property.px != (no_property *)0x0) {
        operator_delete(local_d0.m_property.px);
      }
      std::
      vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config::stored_vertex>_>
      ::~vector(&local_d0.super_type.m_vertices);
      paVar10 = (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
                 *)local_d0.super_type.m_edges.
                   super__List_base<boost::list_edge<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::list_edge<unsigned_long,_multi_agent_planning::Action>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next;
      while (paVar10 != &local_d0) {
        paVar6 = (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
                  *)(paVar10->super_type).m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::list_edge<unsigned_long,_multi_agent_planning::Action>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
        operator_delete(paVar10);
        paVar10 = paVar6;
      }
      iVar18 = iVar18 + 1;
    } while (iVar18 != numSynergies);
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

Scenario::Scenario(const vector<std::vector<Edge> >& actions, 
									const vector<Graph>& graphs, 
									int numConflicts,
									int numSynergies) : 
		interactionMaps(actions.size()), allActions() {

	for (int i = 0; i < actions.size(); ++i) {
		transform(actions[i].begin(), actions[i].end(), 
							back_inserter(allActions), 
							[i](const Edge& e){return make_pair(i, e);});
	}

	set<pair<int, int> > generated;

	for (int i = 0; i < numConflicts; ++i) {

		int actA, actB;
		
		do {
			actA = getRndInt(allActions.size()-1);
			actB = getRndInt(allActions.size()-1);
		} while ((allActions[actA].first == allActions[actB].first) || 
					  (generated.find(make_pair(actA, actB)) != generated.end()));

		generated.insert(make_pair(actA, actB));
 
 		std::pair<int, Edge> action = allActions[actB];

 		Graph g = graphs[action.first];
 		int cost = g[action.second].cost;

 		int interactionCost;
 		do {
 			interactionCost = getRndInt(cost);
 		} while (interactionCost == 0);

		Interaction interaction(allActions[actA], allActions[actB], interactionCost);
		insertInteraction(interaction);
	}

	for (int i = 0; i < numSynergies; ++i) {

		int actA, actB;
		
		do {
			actA = getRndInt(allActions.size()-1);
			actB = getRndInt(allActions.size()-1);
		} while ((allActions[actA].first == allActions[actB].first) || 
					  (generated.find(make_pair(actA, actB)) != generated.end()));

		generated.insert(make_pair(actA, actB));
 
 		std::pair<int, Edge> action = allActions[actB];

 		Graph g = graphs[action.first];
 		int cost = g[action.second].cost;

 		int interactionCost;
 		do {
 			interactionCost = getRndInt(-cost, 0);
 		} while (interactionCost == 0);

		Interaction interaction(allActions[actA], allActions[actB], interactionCost);
		insertInteraction(interaction);
	}
	
}